

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O0

bool __thiscall
bssl::SSLAEADContext::CiphertextLen
          (SSLAEADContext *this,size_t *out_len,size_t in_len,size_t extra_in_len)

{
  bool bVar1;
  size_t sVar2;
  size_t local_38;
  size_t len;
  size_t extra_in_len_local;
  size_t in_len_local;
  size_t *out_len_local;
  SSLAEADContext *this_local;
  
  len = extra_in_len;
  extra_in_len_local = in_len;
  in_len_local = (size_t)out_len;
  out_len_local = (size_t *)this;
  bVar1 = SuffixLen(this,&local_38,in_len,extra_in_len);
  if (bVar1) {
    sVar2 = ExplicitNonceLen(this);
    local_38 = extra_in_len_local + sVar2 + local_38;
    if ((local_38 < extra_in_len_local) || (0xfffe < local_38)) {
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                    ,0x9c);
      this_local._7_1_ = false;
    }
    else {
      *(size_t *)in_len_local = local_38;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SSLAEADContext::CiphertextLen(size_t *out_len, const size_t in_len,
                                   const size_t extra_in_len) const {
  size_t len;
  if (!SuffixLen(&len, in_len, extra_in_len)) {
    return false;
  }
  len += ExplicitNonceLen();
  len += in_len;
  if (len < in_len || len >= 0xffff) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return false;
  }
  *out_len = len;
  return true;
}